

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O2

void __thiscall OpenMD::ForceManager::initialize(ForceManager *this)

{
  InteractionManager *this_00;
  ForceField *pFVar1;
  pointer pdVar2;
  bool bVar3;
  int iVar4;
  pointer pdVar5;
  UniformField *this_01;
  MagneticField *this_02;
  UniformGradient *this_03;
  Light *this_04;
  ThermoIntegrationForceModifier *this_05;
  ZConstraintForceModifier *pZVar6;
  Globals *pGVar7;
  undefined8 in_RCX;
  undefined7 uVar11;
  locale *plVar8;
  LightParameters *pLVar9;
  ulong uVar10;
  pointer pdVar12;
  SimInfo *pSVar13;
  undefined1 local_60 [8];
  string ensembleParam;
  SelectionSet local_38;
  
  if (this->info_->topologyDone_ == false) {
    SimInfo::update(this->info_);
    this_00 = this->interactionMan_;
    this_00->info_ = this->info_;
    InteractionManager::initialize(this_00);
    this->useSurfaceTerm_ = false;
    this->useSlabGeometry_ = false;
    (*this->_vptr_ForceManager[4])(this);
    SimInfo::prepareTopology(this->info_);
    pGVar7 = this->info_->simParams_;
    uVar11 = (undefined7)((ulong)in_RCX >> 8);
    this->doParticlePot_ = (bool)(pGVar7->OutputParticlePotential).super_ParameterBase.field_0x2b;
    bVar3 = (bool)(pGVar7->PrintHeatFlux).super_ParameterBase.field_0x2b;
    this->doHeatFlux_ = bVar3;
    if (bVar3 == true) {
      this->doParticlePot_ = true;
    }
    this->doElectricField_ = (bool)(pGVar7->OutputElectricField).super_ParameterBase.field_0x2b;
    bVar3 = RNEMD::RNEMDParameters::requiresElectricField(pGVar7->rnemdPars_);
    this->doElectricField_ = (bool)(this->doElectricField_ | bVar3);
    pGVar7 = this->info_->simParams_;
    bVar3 = (bool)(pGVar7->OutputSitePotential).super_ParameterBase.field_0x2b;
    plVar8 = (locale *)CONCAT71(uVar11,bVar3);
    this->doSitePotential_ = bVar3;
    if (((pGVar7->UseSurfaceTerm).super_ParameterBase.empty_ == false) &&
       ((pGVar7->UseSurfaceTerm).super_ParameterBase.field_0x2b == '\x01')) {
      if (this->info_->usesElectrostaticAtoms_ == true) {
        this->useSurfaceTerm_ = true;
        if ((pGVar7->UseSlabGeometry).super_ParameterBase.empty_ == false) {
          this->useSlabGeometry_ = (bool)(pGVar7->UseSlabGeometry).super_ParameterBase.field_0x2b;
          std::__cxx11::string::string
                    ((string *)&local_38,(string *)&(pGVar7->PrivilegedAxis).data_);
          std::locale::locale((locale *)local_60);
          toUpperCopy<std::__cxx11::string>
                    (&ensembleParam,(OpenMD *)&local_38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     plVar8);
          std::locale::~locale((locale *)local_60);
          std::__cxx11::string::~string((string *)&local_38);
          iVar4 = std::__cxx11::string::compare((char *)&ensembleParam);
          if (iVar4 == 0) {
            this->axis_ = 0;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&ensembleParam);
            if (iVar4 == 0) {
              this->axis_ = 1;
            }
            else {
              this->axis_ = 2;
            }
          }
          std::__cxx11::string::~string((string *)&ensembleParam);
        }
      }
      else {
        memcpy(&painCave,
               "ForceManager::initialize : useSurfaceTerm was set true\n\tbut no electrostatic atoms are present. OpenMD will\n\tignore this setting.\n"
               ,0x83);
        painCave.isFatal = 0;
        painCave.severity = 2;
        simError();
      }
    }
  }
  pFVar1 = this->forceField_;
  std::vector<double,_std::allocator<double>_>::reserve(&this->vdwScale_,4);
  pdVar2 = (this->vdwScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar5 = (this->vdwScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar5 != pdVar2; pdVar5 = pdVar5 + 1) {
    *pdVar5 = 0.0;
  }
  std::vector<double,_std::allocator<double>_>::reserve(&this->electrostaticScale_,4);
  pdVar2 = (this->electrostaticScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar5 = (this->electrostaticScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar12 = pdVar5; pdVar12 != pdVar2; pdVar12 = pdVar12 + 1) {
    *pdVar12 = 0.0;
  }
  pdVar2 = (this->vdwScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar2 = 1.0;
  pdVar2[1] = (pFVar1->forceFieldOptions_).vdw12scale.data_;
  pdVar2[2] = (pFVar1->forceFieldOptions_).vdw13scale.data_;
  pdVar2[3] = (pFVar1->forceFieldOptions_).vdw14scale.data_;
  *pdVar5 = 1.0;
  pdVar5[1] = (pFVar1->forceFieldOptions_).electrostatic12scale.data_;
  pdVar5[2] = (pFVar1->forceFieldOptions_).electrostatic13scale.data_;
  pdVar5[3] = (pFVar1->forceFieldOptions_).electrostatic14scale.data_;
  pSVar13 = this->info_;
  pGVar7 = pSVar13->simParams_;
  if ((pGVar7->UniformField).super_ParameterBase.empty_ == false) {
    this_01 = (UniformField *)operator_new(0x38);
    UniformField::UniformField(this_01,pSVar13);
    ensembleParam._M_dataplus._M_p = (pointer)this_01;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)&ensembleParam);
    pSVar13 = this->info_;
    pGVar7 = pSVar13->simParams_;
  }
  if ((pGVar7->MagneticField).super_ParameterBase.empty_ == false) {
    this_02 = (MagneticField *)operator_new(0x38);
    MagneticField::MagneticField(this_02,pSVar13);
    ensembleParam._M_dataplus._M_p = (pointer)this_02;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)&ensembleParam);
    pSVar13 = this->info_;
    pGVar7 = pSVar13->simParams_;
  }
  if ((((pGVar7->UniformGradientStrength).super_ParameterBase.empty_ != true) ||
      ((pGVar7->UniformGradientDirection1).super_ParameterBase.empty_ != true)) ||
     ((pGVar7->UniformGradientDirection2).super_ParameterBase.empty_ == false)) {
    this_03 = (UniformGradient *)operator_new(0xa8);
    UniformGradient::UniformGradient(this_03,pSVar13);
    ensembleParam._M_dataplus._M_p = (pointer)this_03;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)&ensembleParam);
    pSVar13 = this->info_;
    pGVar7 = pSVar13->simParams_;
  }
  pLVar9 = pGVar7->lightPars_;
  if ((pLVar9->UseLight).super_ParameterBase.field_0x2b == '\x01') {
    this_04 = (Light *)operator_new(0x120);
    Perturbations::Light::Light(this_04,pSVar13);
    ensembleParam._M_dataplus._M_p = (pointer)this_04;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)&ensembleParam);
    pSVar13 = this->info_;
    pGVar7 = pSVar13->simParams_;
  }
  if ((pGVar7->UseThermodynamicIntegration).super_ParameterBase.field_0x2b == '\x01') {
    this_05 = (ThermoIntegrationForceModifier *)operator_new(0xd0);
    ThermoIntegrationForceModifier::ThermoIntegrationForceModifier(this_05,pSVar13);
LAB_001d97cc:
    ensembleParam._M_dataplus._M_p = (pointer)this_05;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)&ensembleParam);
  }
  else if ((pGVar7->UseRestraints).super_ParameterBase.field_0x2b == '\x01') {
    this_05 = (ThermoIntegrationForceModifier *)operator_new(0xb8);
    RestraintForceModifier::RestraintForceModifier((RestraintForceModifier *)this_05,pSVar13);
    goto LAB_001d97cc;
  }
  std::__cxx11::string::string
            ((string *)&local_38,(string *)&(this->info_->simParams_->Ensemble).data_);
  std::locale::locale((locale *)local_60);
  toUpperCopy<std::__cxx11::string>
            (&ensembleParam,(OpenMD *)&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
             (locale *)pLVar9);
  std::locale::~locale((locale *)local_60);
  std::__cxx11::string::~string((string *)&local_38);
  bVar3 = std::operator==(&ensembleParam,"LHULL");
  if (!bVar3) {
    bVar3 = std::operator==(&ensembleParam,"LANGEVINHULL");
    if (!bVar3) {
      bVar3 = std::operator==(&ensembleParam,"SMIPD");
      if (!bVar3) {
        bVar3 = std::operator==(&ensembleParam,"LANGEVINDYNAMICS");
        if (!bVar3) {
          bVar3 = std::operator==(&ensembleParam,"LD");
          if (!bVar3) goto LAB_001d989d;
        }
        pZVar6 = (ZConstraintForceModifier *)operator_new(0x110);
        LDForceModifier::LDForceModifier((LDForceModifier *)pZVar6,this->info_);
        local_38.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pZVar6;
        std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
        emplace_back<OpenMD::ForceModifier*>
                  ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
                   &this->forceModifiers_,(ForceModifier **)&local_38);
        goto LAB_001d989d;
      }
    }
  }
  memcpy(&painCave,
         "ForceManager: Cannot use the LangevinHull ensembles without qhull.\n\tPlease rebuild OpenMD with qhull enabled."
         ,0x6e);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
LAB_001d989d:
  pSVar13 = this->info_;
  pGVar7 = pSVar13->simParams_;
  uVar10 = (long)(pGVar7->zconstraints_).
                 super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pGVar7->zconstraints_).
                 super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar10 != 0) {
    pSVar13->nZconstraint_ = (int)(uVar10 >> 3);
    pZVar6 = (ZConstraintForceModifier *)operator_new(0x110);
    ZConstraintForceModifier::ZConstraintForceModifier(pZVar6,pSVar13);
    local_38.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pZVar6;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)&local_38);
    pGVar7 = this->info_->simParams_;
  }
  this->usePeriodicBoundaryConditions_ =
       (bool)(pGVar7->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  (*this->fDecomp_->_vptr_ForceDecomposition[3])();
  this->doPotentialSelection_ = false;
  pGVar7 = this->info_->simParams_;
  if ((pGVar7->PotentialSelection).super_ParameterBase.empty_ == false) {
    this->doPotentialSelection_ = true;
    std::__cxx11::string::string((string *)&local_38,(string *)&(pGVar7->PotentialSelection).data_);
    std::__cxx11::string::operator=((string *)&this->selectionScript_,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    SelectionEvaluator::loadScriptString(&this->evaluator_,&this->selectionScript_);
    if ((this->evaluator_).isDynamic_ == false) {
      SelectionEvaluator::evaluate(&local_38,&this->evaluator_);
      SelectionManager::setSelectionSet(&this->seleMan_,&local_38);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_38.bitsets_);
    }
  }
  this->initialized_ = true;
  std::__cxx11::string::~string((string *)&ensembleParam);
  return;
}

Assistant:

void ForceManager::initialize() {
    if (!info_->isTopologyDone()) {
      info_->update();
      interactionMan_->setSimInfo(info_);
      interactionMan_->initialize();

      useSurfaceTerm_  = false;  // default, can be set by Ewald or directly
      useSlabGeometry_ = false;

      //! We want to delay the cutoffs until after the interaction
      //! manager has set up the atom-atom interactions so that we can
      //! query them for suggested cutoff values
      setupCutoffs();

      info_->prepareTopology();

      doParticlePot_ = info_->getSimParams()->getOutputParticlePotential();
      doHeatFlux_    = info_->getSimParams()->getPrintHeatFlux();
      if (doHeatFlux_) doParticlePot_ = true;

      doElectricField_ = info_->getSimParams()->getOutputElectricField();
      doElectricField_ |=
          info_->getSimParams()->getRNEMDParameters()->requiresElectricField();
      doSitePotential_ = info_->getSimParams()->getOutputSitePotential();
      if (info_->getSimParams()->haveUseSurfaceTerm() &&
          info_->getSimParams()->getUseSurfaceTerm()) {
        if (info_->usesElectrostaticAtoms()) {
          useSurfaceTerm_ = info_->getSimParams()->getUseSurfaceTerm();
          if (info_->getSimParams()->haveUseSlabGeometry()) {
            useSlabGeometry_ = info_->getSimParams()->getUseSlabGeometry();

            string axis =
                toUpperCopy(info_->getSimParams()->getPrivilegedAxis());
            if (axis.compare("X") == 0)
              axis_ = 0;
            else if (axis.compare("Y") == 0)
              axis_ = 1;
            else
              axis_ = 2;
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "ForceManager::initialize : useSurfaceTerm was set true\n"
                   "\tbut no electrostatic atoms are present. OpenMD will\n"
                   "\tignore this setting.\n");
          painCave.isFatal  = 0;
          painCave.severity = OPENMD_WARNING;
          simError();
        }
      }
    }

    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();

    //! Force fields can set options on how to scale van der Waals and
    //! electrostatic interactions for atoms connected via bonds, bends
    //! and torsions in this case the topological distance between
    //! atoms is:
    //! 0 = topologically unconnected
    //! 1 = bonded together
    //! 2 = connected via a bend
    //! 3 = connected via a torsion

    vdwScale_.reserve(4);
    fill(vdwScale_.begin(), vdwScale_.end(), 0.0);

    electrostaticScale_.reserve(4);
    fill(electrostaticScale_.begin(), electrostaticScale_.end(), 0.0);

    vdwScale_[0] = 1.0;
    vdwScale_[1] = fopts.getvdw12scale();
    vdwScale_[2] = fopts.getvdw13scale();
    vdwScale_[3] = fopts.getvdw14scale();

    electrostaticScale_[0] = 1.0;
    electrostaticScale_[1] = fopts.getelectrostatic12scale();
    electrostaticScale_[2] = fopts.getelectrostatic13scale();
    electrostaticScale_[3] = fopts.getelectrostatic14scale();

    // Initialize the perturbations
    if (info_->getSimParams()->haveUniformField()) {
      UniformField* eField = new UniformField(info_);
      forceModifiers_.push_back(eField);
    }

    if (info_->getSimParams()->haveMagneticField()) {
      MagneticField* mField = new MagneticField(info_);
      forceModifiers_.push_back(mField);
    }

    if (info_->getSimParams()->haveUniformGradientStrength() ||
        info_->getSimParams()->haveUniformGradientDirection1() ||
        info_->getSimParams()->haveUniformGradientDirection2()) {
      UniformGradient* eGrad = new UniformGradient(info_);
      forceModifiers_.push_back(eGrad);
    }

    if (info_->getSimParams()->getLightParameters()->getUseLight()) {
      Perturbations::Light* light = new Perturbations::Light(info_);
      forceModifiers_.push_back(light);
    }

    // Initialize the force modifiers (order matters)
    if (info_->getSimParams()->getUseThermodynamicIntegration()) {
      ThermoIntegrationForceModifier* thermoInt =
          new ThermoIntegrationForceModifier(info_);
      forceModifiers_.push_back(thermoInt);
    } else if (info_->getSimParams()->getUseRestraints()) {
      RestraintForceModifier* restraint = new RestraintForceModifier(info_);
      forceModifiers_.push_back(restraint);
    }

    std::string ensembleParam =
        toUpperCopy(info_->getSimParams()->getEnsemble());

    if (ensembleParam == "LHULL" || ensembleParam == "LANGEVINHULL" ||
        ensembleParam == "SMIPD") {
#if defined(HAVE_QHULL)
      LangevinHullForceModifier* langevinHullFM =
          new LangevinHullForceModifier(info_);
      forceModifiers_.push_back(langevinHullFM);
#else
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "ForceManager: Cannot use the LangevinHull ensembles without qhull.\n"
          "\tPlease rebuild OpenMD with qhull enabled.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
#endif
    } else if (ensembleParam == "LANGEVINDYNAMICS" || ensembleParam == "LD") {
      LDForceModifier* langevinDynamicsFM = new LDForceModifier(info_);
      forceModifiers_.push_back(langevinDynamicsFM);
    }

    if (info_->getSimParams()->getNZconsStamps() > 0) {
      info_->setNZconstraint(info_->getSimParams()->getNZconsStamps());
      ZConstraintForceModifier* zCons = new ZConstraintForceModifier(info_);
      forceModifiers_.push_back(zCons);
    }

    usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    fDecomp_->distributeInitialData();

    doPotentialSelection_ = false;
    if (info_->getSimParams()->havePotentialSelection()) {
      doPotentialSelection_ = true;
      selectionScript_      = info_->getSimParams()->getPotentialSelection();
      evaluator_.loadScriptString(selectionScript_);
      if (!evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }
    }

    initialized_ = true;
  }